

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.c
# Opt level: O2

int dbg_text(char *tgt,int min,int max,int sd)

{
  byte bVar1;
  char cVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  size_t sVar8;
  size_t sVar9;
  char *pcVar10;
  char *pcVar11;
  distribution *s;
  byte *pbVar12;
  char *pcVar14;
  long length;
  char syntax [13];
  char syntax_1 [13];
  char sentence [257];
  ulong local_178;
  ulong local_170;
  char *local_168;
  char *local_160;
  byte local_152 [13];
  char local_145 [13];
  char local_138 [264];
  byte *pbVar13;
  
  local_178 = 0;
  dss_random((long *)&local_178,(long)min,(long)max,(long)sd);
  local_170 = 0;
LAB_00105293:
  pcVar11 = local_138;
  if ((long)local_178 <= (long)(int)local_170) {
    *tgt = '\0';
    return (int)local_170;
  }
  local_168 = tgt;
  pick_str(&grammar,sd,(char *)local_152);
  iVar4 = 0;
  sVar9 = 0;
  pbVar13 = local_152;
LAB_001052cb:
  do {
    pcVar14 = local_168;
    uVar3 = local_178;
    pbVar12 = pbVar13 + 1;
    bVar1 = *pbVar13;
    pbVar13 = pbVar12;
  } while (bVar1 == 0x20);
  pcVar10 = pcVar11;
  switch(bVar1) {
  case 0x4e:
    uVar5 = txt_np(pcVar11,sd);
    sVar9 = (size_t)uVar5;
    break;
  case 0x4f:
  case 0x51:
  case 0x52:
  case 0x53:
  case 0x55:
    break;
  case 0x50:
    iVar7 = pick_str(&prepositions,sd,pcVar11);
    sVar9 = strlen(prepositions.list[iVar7].text);
    iVar7 = (int)sVar9;
    builtin_strncpy(pcVar11 + iVar7," the ",6);
    iVar6 = txt_np(pcVar11 + iVar7 + 5,sd);
    sVar9 = (size_t)(iVar7 + iVar6 + 5);
    break;
  case 0x54:
    iVar7 = pick_str(&terminators,sd,pcVar11 + -1);
    sVar9 = strlen(terminators.list[iVar7].text);
    pcVar10 = pcVar11 + -1;
    break;
  case 0x56:
    pcVar14 = local_145;
    pick_str(&vp,sd,pcVar14);
    sVar9 = 0;
    local_160 = pcVar11;
    while (pcVar14 = strtok(pcVar14," "), pcVar10 = local_160, pcVar14 != (char *)0x0) {
      cVar2 = *pcVar14;
      if (cVar2 == 'X') {
        s = &auxillaries;
      }
      else if (cVar2 == 'V') {
        s = &verbs;
      }
      else if (cVar2 == 'D') {
        s = &adverbs;
      }
      else {
        s = (distribution *)0x0;
      }
      iVar7 = pick_str(s,sd,pcVar11);
      sVar8 = strlen(s->list[iVar7].text);
      pcVar11 = pcVar11 + (int)sVar8;
      iVar7 = (int)sVar9 + (int)sVar8;
      if (pcVar14[1] != '\0') {
        iVar7 = iVar7 + 1;
        pcVar11[1] = pcVar14[1];
        pcVar11 = pcVar11 + 1;
      }
      *pcVar11 = ' ';
      pcVar11 = pcVar11 + 1;
      sVar9 = (size_t)(iVar7 + 1);
      pcVar14 = (char *)0x0;
    }
    break;
  default:
    if (bVar1 == 0) goto LAB_00105499;
  }
  pcVar11 = pcVar10 + (int)sVar9;
  iVar4 = (int)sVar9 + iVar4;
  if ((*pbVar12 & 0xdf) != 0) {
    iVar4 = iVar4 + 1;
    pcVar11[1] = *pbVar12;
    pcVar11 = pcVar11 + 1;
  }
  goto LAB_001052cb;
LAB_00105499:
  *pcVar11 = '\0';
  if (iVar4 < 1) {
    fputs("Bad sentence formation",_stderr);
    abort();
  }
  iVar6 = (int)local_170;
  iVar7 = (int)local_178 - iVar6;
  if (iVar7 < iVar4) {
    local_138[iVar7] = '\0';
    strcpy(local_168,local_138);
    tgt = pcVar14 + iVar7;
    local_170 = uVar3 & 0xffffffff;
  }
  else {
    strcpy(local_168,local_138);
    local_170 = (ulong)(uint)(iVar6 + iVar4);
    pcVar14 = pcVar14 + (iVar4 - 1);
    tgt = pcVar14 + 1;
    *pcVar14 = ' ';
  }
  goto LAB_00105293;
}

Assistant:

int
dbg_text(char *tgt, int min, int max, int sd)
{
	long length = 0; 
	int wordlen = 0,
		needed,
		s_len;
	char sentence[MAX_SENT_LEN + 1];
	
	RANDOM(length, min, max, sd);

	while (wordlen < length)
	{
		s_len = txt_sentence(sentence, sd);
		if ( s_len < 0)
			INTERNAL_ERROR("Bad sentence formation");
		needed = length - wordlen;
		if (needed >= s_len + 1)	/* need the entire sentence */
		{
			strcpy(tgt, sentence);
			tgt += s_len;
			wordlen += s_len + 1;
			*(tgt++) = ' ';
		}
		else /* chop the new sentence off to match the length target */
		{
			sentence[needed] = '\0';
			strcpy(tgt, sentence);
			wordlen += needed;
			tgt += needed;
		}
	}
	*tgt = '\0';

	return(wordlen);
}